

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

SeatPromptResult *
console_confirm_ssh_host_key
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *host,wchar_t port,char *keytype
          ,char *keystr,SeatDialogText *text,HelpCtx helpctx,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  SeatDialogTextType SVar1;
  uint uVar2;
  size_t len;
  char *pcVar3;
  SeatDialogTextItem *pSVar4;
  void *buf;
  char *pcVar5;
  char *unaff_R13;
  SeatDialogTextItem *pSVar6;
  ptrlen input;
  termios newmode;
  char line [32];
  termios oldmode;
  termios cf;
  stdio_sink errsink [1];
  
  stdio_sink_init(errsink,(FILE *)_stderr);
  premsg(&cf);
  pSVar6 = text->items;
  pSVar4 = pSVar6 + text->nitems;
  do {
    if (pSVar4 <= pSVar6) {
      do {
        fprintf(_stderr,"%s (y/n, Return cancels connection, i for more info) ",unaff_R13);
        fflush(_stderr);
        tcgetattr(0,(termios *)&oldmode);
        newmode.c_iflag = oldmode.c_iflag;
        newmode.c_oflag = oldmode.c_oflag;
        newmode.c_line = oldmode.c_line;
        newmode.c_cc[0] = oldmode.c_cc[0];
        newmode.c_cc[1] = oldmode.c_cc[1];
        newmode.c_cc[2] = oldmode.c_cc[2];
        newmode.c_cc[3] = oldmode.c_cc[3];
        newmode.c_cc[4] = oldmode.c_cc[4];
        newmode.c_cc[5] = oldmode.c_cc[5];
        newmode.c_cc[6] = oldmode.c_cc[6];
        newmode.c_cc[7] = oldmode.c_cc[7];
        newmode.c_cc[8] = oldmode.c_cc[8];
        newmode.c_cc[9] = oldmode.c_cc[9];
        newmode.c_cc[10] = oldmode.c_cc[10];
        newmode.c_cc[0xb] = oldmode.c_cc[0xb];
        newmode.c_cc[0xc] = oldmode.c_cc[0xc];
        newmode.c_cc[0xd] = oldmode.c_cc[0xd];
        newmode.c_cc[0xe] = oldmode.c_cc[0xe];
        newmode.c_cc[0xf] = oldmode.c_cc[0xf];
        newmode.c_cc[0x10] = oldmode.c_cc[0x10];
        newmode.c_cc[0x11] = oldmode.c_cc[0x11];
        newmode.c_cc[0x12] = oldmode.c_cc[0x12];
        newmode.c_cc[0x13] = oldmode.c_cc[0x13];
        newmode.c_cc[0x14] = oldmode.c_cc[0x14];
        newmode.c_cc[0x15] = oldmode.c_cc[0x15];
        newmode.c_cc[0x16] = oldmode.c_cc[0x16];
        newmode.c_ispeed = oldmode.c_ispeed;
        newmode.c_ospeed = oldmode.c_ospeed;
        newmode._8_8_ = oldmode._8_8_ | 0xb00000000;
        buf = (void *)0x0;
        tcsetattr(0,0,(termios *)&newmode);
        line[0] = '\0';
        block_and_read((wchar_t)line,buf,len);
        tcsetattr(0,0,(termios *)&oldmode);
        if ((line[0] & 0xdfU) != 0x49) {
          uVar2 = (uint)(byte)line[0];
          if (((((byte)line[0] < 0xe) && ((0x2401U >> (uVar2 & 0x1f) & 1) != 0)) || (uVar2 == 0x51))
             || (uVar2 == 0x71)) {
            fputs("Connection abandoned.\n",_stderr);
            postmsg(&cf);
            __return_storage_ptr__->kind = SPRK_USER_ABORT;
          }
          else {
            if ((line[0] & 0xdfU) == 0x59) {
              store_host_key(host,port,keytype,keystr);
            }
            postmsg(&cf);
            __return_storage_ptr__->kind = SPRK_OK;
          }
          __return_storage_ptr__->errdata_lit = (char *)0x0;
          return __return_storage_ptr__;
        }
        pSVar6 = text->items;
        pSVar4 = pSVar6 + text->nitems;
        for (; pSVar6 < pSVar4; pSVar6 = pSVar6 + 1) {
          SVar1 = pSVar6->type;
          if (SVar1 == SDT_MORE_INFO_VALUE_BLOB) {
            pcVar3 = pSVar6->text;
            pcVar5 = ":\n%s\n";
LAB_00119c1e:
            fprintf(_stderr,pcVar5,pcVar3);
          }
          else {
            if (SVar1 == SDT_MORE_INFO_VALUE_SHORT) {
              pcVar3 = pSVar6->text;
              pcVar5 = ": %s\n";
              goto LAB_00119c1e;
            }
            if (SVar1 == SDT_MORE_INFO_KEY) {
              fputs(pSVar6->text,_stderr);
            }
          }
        }
      } while( true );
    }
    switch(pSVar6->type) {
    case SDT_PARA:
      input = ptrlen_from_asciz(pSVar6->text);
      wordwrap(errsink[0].binarysink_,input,0x3c);
      fputc(10,_stderr);
      break;
    case SDT_DISPLAY:
      pcVar3 = pSVar6->text;
      pcVar5 = "  %s\n";
      goto LAB_00119b0e;
    case SDT_SCARY_HEADING:
      pcVar3 = pSVar6->text;
      pcVar5 = "%s\n";
LAB_00119b0e:
      fprintf(_stderr,pcVar5,pcVar3);
      break;
    case SDT_PROMPT:
      unaff_R13 = pSVar6->text;
      break;
    case SDT_BATCH_ABORT:
      if (console_batch_mode == true) {
        fprintf(_stderr,"%s\n",pSVar6->text);
        fflush(_stderr);
        postmsg(&cf);
        make_spr_sw_abort_static(__return_storage_ptr__,"Cannot confirm a host key in batch mode");
        return __return_storage_ptr__;
      }
    }
    pSVar6 = pSVar6 + 1;
  } while( true );
}

Assistant:

SeatPromptResult console_confirm_ssh_host_key(
    Seat *seat, const char *host, int port, const char *keytype,
    char *keystr, SeatDialogText *text, HelpCtx helpctx,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    char line[32];
    struct termios cf;
    const char *prompt;

    stdio_sink errsink[1];
    stdio_sink_init(errsink, stderr);

    premsg(&cf);

    for (SeatDialogTextItem *item = text->items,
             *end = item+text->nitems; item < end; item++) {
        switch (item->type) {
          case SDT_PARA:
            wordwrap(BinarySink_UPCAST(errsink),
                     ptrlen_from_asciz(item->text), 60);
            fputc('\n', stderr);
            break;
          case SDT_DISPLAY:
            fprintf(stderr, "  %s\n", item->text);
            break;
          case SDT_SCARY_HEADING:
            /* Can't change font size or weight in this context */
            fprintf(stderr, "%s\n", item->text);
            break;
          case SDT_BATCH_ABORT:
            if (console_batch_mode) {
                fprintf(stderr, "%s\n", item->text);
                fflush(stderr);
                postmsg(&cf);
                return SPR_SW_ABORT("Cannot confirm a host key in batch mode");
            }
            break;
          case SDT_PROMPT:
            prompt = item->text;
            break;
          default:
            break;
        }
    }

    while (true) {
        fprintf(stderr,
                "%s (y/n, Return cancels connection, i for more info) ",
                prompt);
        fflush(stderr);

        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);

        if (line[0] == 'i' || line[0] == 'I') {
            for (SeatDialogTextItem *item = text->items,
                     *end = item+text->nitems; item < end; item++) {
                switch (item->type) {
                  case SDT_MORE_INFO_KEY:
                    fprintf(stderr, "%s", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_SHORT:
                    fprintf(stderr, ": %s\n", item->text);
                    break;
                  case SDT_MORE_INFO_VALUE_BLOB:
                    fprintf(stderr, ":\n%s\n", item->text);
                    break;
                  default:
                    break;
                }
            }
        } else {
            break;
        }
    }

    /* In case of misplaced reflexes from another program, also recognise 'q'
     * as 'abandon connection rather than trust this key' */
    if (line[0] != '\0' && line[0] != '\r' && line[0] != '\n' &&
        line[0] != 'q' && line[0] != 'Q') {
        if (line[0] == 'y' || line[0] == 'Y')
            store_host_key(host, port, keytype, keystr);
        postmsg(&cf);
        return SPR_OK;
    } else {
        fputs(console_abandoned_msg, stderr);
        postmsg(&cf);
        return SPR_USER_ABORT;
    }
}